

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeThreeAddrSRegInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t RegNo_01;
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint shift;
  uint shiftLo;
  uint shiftHi;
  uint Rm;
  uint Rn;
  uint Rd;
  void *Decoder_local;
  uint64_t Addr_local;
  uint32_t insn_local;
  MCInst *Inst_local;
  
  RegNo = fieldFromInstruction(insn,0,5);
  RegNo_00 = fieldFromInstruction(insn,5,5);
  RegNo_01 = fieldFromInstruction(insn,0x10,5);
  uVar1 = fieldFromInstruction(insn,0x16,2);
  uVar2 = fieldFromInstruction(insn,10,6);
  uVar3 = MCInst_getOpcode(Inst);
  if (uVar3 == 0x30) {
LAB_001a6476:
    if (uVar1 == 3) {
      return MCDisassembler_Fail;
    }
  }
  else {
    if (uVar3 == 0x34) {
LAB_001a64df:
      if (uVar1 == 3) {
        return MCDisassembler_Fail;
      }
LAB_001a64f0:
      DecodeGPR64RegisterClass(Inst,RegNo,Addr,Decoder);
      DecodeGPR64RegisterClass(Inst,RegNo_00,Addr,Decoder);
      DecodeGPR64RegisterClass(Inst,RegNo_01,Addr,Decoder);
      goto LAB_001a652c;
    }
    if (uVar3 == 0x3e) goto LAB_001a6476;
    if (uVar3 == 0x42) goto LAB_001a64df;
    if (uVar3 != 0x57) {
      if (uVar3 != 0x5a) {
        if (uVar3 == 0x5d) goto LAB_001a648a;
        if (uVar3 != 0x60) {
          if (uVar3 == 0x69) goto LAB_001a648a;
          if (uVar3 != 0x6b) {
            if (uVar3 == 0x6d) goto LAB_001a648a;
            if (uVar3 != 0x6f) {
              if (uVar3 == 0x121) goto LAB_001a648a;
              if (uVar3 != 0x123) {
                if (uVar3 == 0x126) goto LAB_001a648a;
                if (uVar3 != 0x129) {
                  if (uVar3 == 0x480) goto LAB_001a648a;
                  if (uVar3 != 0x482) {
                    if (uVar3 == 0x487) goto LAB_001a648a;
                    if (uVar3 != 0x48a) {
                      if (uVar3 == 0x79d) goto LAB_001a6476;
                      if (uVar3 != 0x7a1) {
                        if (uVar3 == 0x7a6) goto LAB_001a6476;
                        if (uVar3 != 0x7aa) {
                          return MCDisassembler_Fail;
                        }
                      }
                      goto LAB_001a64df;
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_001a64f0;
    }
  }
LAB_001a648a:
  if (uVar2 >> 5 == 1) {
    return MCDisassembler_Fail;
  }
  DecodeGPR32RegisterClass(Inst,RegNo,Addr,Decoder);
  DecodeGPR32RegisterClass(Inst,RegNo_00,Addr,Decoder);
  DecodeGPR32RegisterClass(Inst,RegNo_01,Addr,Decoder);
LAB_001a652c:
  MCOperand_CreateImm0(Inst,(ulong)(uVar1 << 6 | uVar2));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeThreeAddrSRegInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Rm = fieldFromInstruction(insn, 16, 5);
	unsigned shiftHi = fieldFromInstruction(insn, 22, 2);
	unsigned shiftLo = fieldFromInstruction(insn, 10, 6);
	unsigned shift = (shiftHi << 6) | shiftLo;

	switch (MCInst_getOpcode(Inst)) {
		default:
			return Fail;
		case AArch64_ADDWrs:
		case AArch64_ADDSWrs:
		case AArch64_SUBWrs:
		case AArch64_SUBSWrs:
			// if shift == '11' then ReservedValue()
			if (shiftHi == 0x3)
				return Fail;
			// Deliberate fallthrough
		case AArch64_ANDWrs:
		case AArch64_ANDSWrs:
		case AArch64_BICWrs:
		case AArch64_BICSWrs:
		case AArch64_ORRWrs:
		case AArch64_ORNWrs:
		case AArch64_EORWrs:
		case AArch64_EONWrs: {
				// if sf == '0' and imm6<5> == '1' then ReservedValue()
				if (shiftLo >> 5 == 1)
					return Fail;
				DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
				DecodeGPR32RegisterClass(Inst, Rn, Addr, Decoder);
				DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
				break;
			}
		case AArch64_ADDXrs:
		case AArch64_ADDSXrs:
		case AArch64_SUBXrs:
		case AArch64_SUBSXrs:
				 // if shift == '11' then ReservedValue()
				 if (shiftHi == 0x3)
					 return Fail;
				 // Deliberate fallthrough
		case AArch64_ANDXrs:
		case AArch64_ANDSXrs:
		case AArch64_BICXrs:
		case AArch64_BICSXrs:
		case AArch64_ORRXrs:
		case AArch64_ORNXrs:
		case AArch64_EORXrs:
		case AArch64_EONXrs:
				 DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
				 DecodeGPR64RegisterClass(Inst, Rn, Addr, Decoder);
				 DecodeGPR64RegisterClass(Inst, Rm, Addr, Decoder);
				 break;
	}

	MCOperand_CreateImm0(Inst, shift);
	return Success;
}